

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall pugi::xml_node::append_copy(xml_node *this,xml_attribute *proto)

{
  bool bVar1;
  xml_node_type parent;
  xml_attribute_struct *attr;
  xml_attribute local_30;
  xml_attribute a;
  xml_allocator *alloc;
  xml_attribute *proto_local;
  xml_node *this_local;
  
  bVar1 = xml_attribute::operator!(proto);
  if (bVar1) {
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
  }
  else {
    parent = type(this);
    bVar1 = impl::anon_unknown_0::allow_insert_attribute(parent);
    if (bVar1) {
      a._attr = (xml_attribute_struct *)
                impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve((xml_allocator *)a._attr);
      if (bVar1) {
        attr = impl::anon_unknown_0::allocate_attribute(a._attr);
        xml_attribute::xml_attribute(&local_30,attr);
        bVar1 = xml_attribute::operator!(&local_30);
        if (bVar1) {
          xml_attribute::xml_attribute((xml_attribute *)&this_local);
        }
        else {
          impl::anon_unknown_0::append_attribute(local_30._attr,this->_root);
          impl::anon_unknown_0::node_copy_attribute(local_30._attr,proto->_attr);
          this_local = (xml_node *)local_30._attr;
        }
      }
      else {
        xml_attribute::xml_attribute((xml_attribute *)&this_local);
      }
    }
    else {
      xml_attribute::xml_attribute((xml_attribute *)&this_local);
    }
  }
  return (xml_attribute)(xml_attribute_struct *)this_local;
}

Assistant:

PUGI__FN xml_attribute xml_node::append_copy(const xml_attribute& proto)
	{
		if (!proto) return xml_attribute();
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::append_attribute(a._attr, _root);
		impl::node_copy_attribute(a._attr, proto._attr);

		return a;
	}